

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void writeSignature(ucvector *out)

{
  uint uVar1;
  
  uVar1 = ucvector_resize(out,out->size + 1);
  if (uVar1 != 0) {
    out->data[out->size - 1] = 0x89;
  }
  uVar1 = ucvector_resize(out,out->size + 1);
  if (uVar1 != 0) {
    out->data[out->size - 1] = 'P';
  }
  uVar1 = ucvector_resize(out,out->size + 1);
  if (uVar1 != 0) {
    out->data[out->size - 1] = 'N';
  }
  uVar1 = ucvector_resize(out,out->size + 1);
  if (uVar1 != 0) {
    out->data[out->size - 1] = 'G';
  }
  uVar1 = ucvector_resize(out,out->size + 1);
  if (uVar1 != 0) {
    out->data[out->size - 1] = '\r';
  }
  uVar1 = ucvector_resize(out,out->size + 1);
  if (uVar1 != 0) {
    out->data[out->size - 1] = '\n';
  }
  uVar1 = ucvector_resize(out,out->size + 1);
  if (uVar1 != 0) {
    out->data[out->size - 1] = '\x1a';
  }
  uVar1 = ucvector_resize(out,out->size + 1);
  if (uVar1 != 0) {
    out->data[out->size - 1] = '\n';
  }
  return;
}

Assistant:

static void writeSignature(ucvector* out) {
  /*8 bytes PNG signature, aka the magic bytes*/
  ucvector_push_back(out, 137);
  ucvector_push_back(out, 80);
  ucvector_push_back(out, 78);
  ucvector_push_back(out, 71);
  ucvector_push_back(out, 13);
  ucvector_push_back(out, 10);
  ucvector_push_back(out, 26);
  ucvector_push_back(out, 10);
}